

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O1

void __thiscall reader_url_suite::test_path_absolute_two::test_method(test_path_absolute_two *this)

{
  size_t *psVar1;
  undefined1 *puVar2;
  bool bVar3;
  int iVar4;
  view_type local_310;
  view_type *local_300;
  view_type local_2f8;
  undefined8 *local_2e8;
  view_type **local_2e0;
  undefined **local_2d8;
  undefined1 local_2d0;
  undefined8 *local_2c8;
  size_t *local_2c0;
  undefined **local_2b8;
  undefined1 local_2b0;
  undefined8 *local_2a8;
  char *local_2a0;
  undefined1 local_298 [8];
  undefined8 local_290;
  shared_count sStack_288;
  char *local_280;
  char *local_278;
  url reader;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char input [17];
  
  local_2f8.ptr_ = input;
  builtin_strncpy(input,"scheme:/path/two",0x11);
  local_2f8.len_ = strlen(local_2f8.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_2f8);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0xae);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_300 = &local_310;
  local_310.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_310.len_ = (long)&local_310.ptr_ + 4;
  local_298[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token == scheme;
  local_310.ptr_._4_4_ = 2;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2e0 = &local_300;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 0;
  local_2c0 = &local_310.len_;
  local_2d8 = &PTR__lazy_ostream_00186618;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_78,0xaf);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 6) {
    iVar4 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"scheme",6
                );
    local_298[0] = iVar4 == 0;
  }
  else {
    local_298[0] = false;
  }
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_300;
  local_310.len_ = 0x16fe2f;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186358;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_310.len_;
  local_300 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xaf,2,2,2,"reader.literal()",&local_2f8,"\"scheme\"",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0xb0);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_298[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_300 = &local_310;
  local_310.ptr_._0_4_ = CONCAT31(local_310.ptr_._1_3_,local_298[0]);
  local_310.ptr_._4_4_ = CONCAT31(local_310.ptr_._5_3_,1);
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_310.len_ = (long)&local_310.ptr_ + 4;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001865d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_310.len_;
  local_2e0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb0,2,2,2,"reader.next()",&local_2f8,"true",&local_2d8
            );
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0xb1);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_310.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::category
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_310.ptr_._4_4_ = 3;
  local_298[0] = (value)local_310.ptr_ == path;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_300 = &local_310;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186518;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_310.len_ = (long)&local_310.ptr_ + 4;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186518;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_310.len_;
  local_2e0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb1,2,2,2,"reader.category()",&local_2f8,
             "url::token::category::path",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0xb2);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_310.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_310.ptr_._4_4_ = 6;
  local_298[0] = (value)local_310.ptr_ == path_segment;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_300 = &local_310;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186558;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_310.len_ = (long)&local_310.ptr_ + 4;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186558;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_310.len_;
  local_2e0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb2,2,2,2,"reader.code()",&local_2f8,
             "url::token::code::path_segment",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0xb3);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_298[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_310.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_310.ptr_._4_4_ = 8;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_300 = &local_310;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_300;
  local_310.len_ = (long)&local_310.ptr_ + 4;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186618;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_310.len_;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb3,2,2,2,"reader.subcode()",&local_2f8,
             "url::token::subcode::path_segment",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0xb4);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 4) {
    iVar4 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"path",4);
    local_298[0] = iVar4 == 0;
  }
  else {
    local_298[0] = false;
  }
  psVar1 = &local_310.len_;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_300 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_310.len_ = 0x16ffdb;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186698;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_300;
  local_2c0 = psVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb4,2,2,2,"reader.literal()",&local_2f8,"\"path\"",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0xb5);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_298[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_310.ptr_._0_4_ = CONCAT31(local_310.ptr_._1_3_,local_298[0]);
  local_310.ptr_._4_4_ = CONCAT31(local_310.ptr_._5_3_,1);
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_300 = &local_310;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_310.len_ = (long)&local_310.ptr_ + 4;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001865d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_300;
  local_2c0 = psVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb5,2,2,2,"reader.next()",&local_2f8,"true",&local_2d8
            );
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0xb6);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_310.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::category
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_310.ptr_._4_4_ = 3;
  local_298[0] = (value)local_310.ptr_ == path;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_300 = &local_310;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186518;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_310.len_ = (long)&local_310.ptr_ + 4;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186518;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_300;
  local_2c0 = psVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb6,2,2,2,"reader.category()",&local_2f8,
             "url::token::category::path",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0xb7);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_310.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_310.ptr_._4_4_ = 6;
  local_298[0] = (value)local_310.ptr_ == path_segment;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_300 = &local_310;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186558;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  puVar2 = (undefined1 *)((long)&local_310.ptr_ + 4);
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186558;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_310.len_ = (size_t)puVar2;
  local_2e0 = &local_300;
  local_2c0 = psVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb7,2,2,2,"reader.code()",&local_2f8,
             "url::token::code::path_segment",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0xb8);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  local_298[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_310.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_310.ptr_._4_4_ = 8;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_300 = &local_310;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_2e0 = &local_300;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00186618;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_310.len_;
  local_310.len_ = (size_t)puVar2;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb8,2,2,2,"reader.subcode()",&local_2f8,
             "url::token::subcode::path_segment",&local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0xb9);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 3) {
    iVar4 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"two",3);
    local_298[0] = iVar4 == 0;
  }
  else {
    local_298[0] = false;
  }
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_300 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_310.len_ = 0x173e40;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001866d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_310.len_;
  local_2e0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xb9,2,2,2,"reader.literal()",&local_2f8,"\"two\"",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1d0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0xba);
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_00186260;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = "";
  bVar3 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_310.ptr_._0_4_ = CONCAT31(local_310.ptr_._1_3_,bVar3);
  local_310.ptr_._4_4_ = local_310.ptr_._4_4_ & 0xffffff00;
  local_298[0] = !bVar3;
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_278 = "";
  local_300 = &local_310;
  local_2f8.len_ = local_2f8.len_ & 0xffffffffffffff00;
  local_2f8.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2e8 = &boost::unit_test::lazy_ostream::inst;
  local_310.len_ = (long)&local_310.ptr_ + 4;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_001865d8;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_310.len_;
  local_2e0 = &local_300;
  boost::test_tools::tt_detail::report_assertion
            (local_298,&local_2b8,&local_280,0xba,2,2,2,"reader.next()",&local_2f8,"false",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_288);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_absolute_two)
{
    const char input[] = "scheme:/path/two";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "two");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}